

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O1

_Bool monster_can_cast(monster_conflict *mon,_Bool innate)

{
  int iVar1;
  int iVar2;
  loc grid2;
  loc grid;
  loc grid2_00;
  ulong uVar3;
  _Bool _Var4;
  uint32_t uVar5;
  wchar_t wVar6;
  loc *gp;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  loc tgrid;
  wchar_t tdist;
  loc local_38;
  uint local_2c;
  
  iVar1 = *(int *)(mon->race->flags + (ulong)!innate * 4 + -0xc);
  monster_get_target_dist_grid(mon,(int *)&local_2c,&local_38);
  _Var4 = flag_has_dbg(mon->mflag,2,3,"mon->mflag","MFLAG_NICE");
  if (iVar1 != 0 && !_Var4) {
    iVar2 = iVar1 / 2;
    if (player->timed[0x30] == 0) {
      iVar2 = iVar1;
    }
    bVar9 = local_2c == mon->best_range;
    uVar5 = Rand_div(100);
    if ((((int)uVar5 < iVar2 << bVar9) && ((int)local_2c <= (int)(uint)z_info->max_range)) &&
       (grid2.y = local_38.y, grid2.x = local_38.x,
       _Var4 = projectable((chunk *)cave,mon->grid,grid2,L'\x2000'), _Var4)) {
      if (((local_38.x != (player->grid).x) || (local_38.y != (player->grid).y)) &&
         ((_Var4 = square_isview(cave,mon->grid), !_Var4 &&
          (grid.y = local_38.y, grid.x = local_38.x, _Var4 = square_isview(cave,grid), !_Var4)))) {
        gp = (loc *)mem_alloc((ulong)z_info->max_range << 3);
        grid2_00.y = local_38.y;
        grid2_00.x = local_38.x;
        wVar6 = project_path((chunk *)cave,gp,(uint)z_info->max_range,mon->grid,grid2_00,L'\x2000');
        bVar9 = L'\0' < wVar6;
        if ((L'\0' < wVar6) && (_Var4 = square_isview(cave,*gp), !_Var4)) {
          uVar7 = (ulong)(uint)wVar6;
          uVar3 = 1;
          do {
            uVar8 = uVar3;
            if (uVar7 == uVar8) {
              bVar9 = uVar8 < uVar7;
              goto LAB_00165358;
            }
            _Var4 = square_isview(cave,gp[uVar8]);
            uVar3 = uVar8 + 1;
          } while (!_Var4);
          bVar9 = uVar8 < uVar7;
        }
LAB_00165358:
        mem_free(gp);
        if (!bVar9) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

static bool monster_can_cast(struct monster *mon, bool innate)
{
	int chance = innate ? mon->race->freq_innate : mon->race->freq_spell;
	int tdist;
	struct loc tgrid;

	monster_get_target_dist_grid(mon, &tdist, &tgrid);

	/* Cannot cast spells when nice */
	if (mflag_has(mon->mflag, MFLAG_NICE)) return false;

	/* Not allowed to cast spells */
	if (!chance) return false;

	/* Taunted monsters are likely just to attack */
	if (player->timed[TMD_TAUNT]) {
		chance /= 2;
	}

	/* Monsters at their preferred range are more likely to cast */
	if (tdist == mon->best_range) {
		chance *= 2;
	}

	/* Only do spells occasionally */
	if (randint0(100) >= chance) return false;

	/* Check range */
	if (tdist > z_info->max_range) return false;

	/* Check path */
	if (!projectable(cave, mon->grid, tgrid, PROJECT_SHORT))
		return false;

	/* If the target isn't the player, only cast if the player can witness */
	if ((tgrid.x != player->grid.x || tgrid.y != player->grid.y) &&
		!square_isview(cave, mon->grid) &&
		!square_isview(cave, tgrid)) {
		struct loc *path = mem_alloc(z_info->max_range * sizeof(*path));
		int npath, ipath;

		npath = project_path(cave, path, z_info->max_range, mon->grid,
			tgrid, PROJECT_SHORT);
		ipath = 0;
		while (1) {
			if (ipath >= npath) {
				/* No point on path visible.  Don't cast. */
				mem_free(path);
				return false;
			}
			if (square_isview(cave, path[ipath])) {
				break;
			}
			++ipath;
		}
		mem_free(path);
	}

	return true;
}